

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Assign<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state,string_t *x,string_t *y,
               bool x_null)

{
  undefined7 in_register_00000009;
  string_t new_value;
  string_t new_value_00;
  
  new_value.value._8_8_ = CONCAT71(in_register_00000009,x_null);
  (state->super_ArgMinMaxStateBase).arg_null = x_null;
  if ((int)new_value.value._8_8_ == 0) {
    new_value.value._0_8_ = (x->value).pointer.ptr;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&state->arg,*(string_t **)&x->value,new_value);
  }
  new_value_00.value.pointer.ptr = (char *)new_value.value._8_8_;
  new_value_00.value._0_8_ = (y->value).pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->value,*(string_t **)&y->value,new_value_00);
  return;
}

Assistant:

static void Assign(STATE &state, const A_TYPE &x, const B_TYPE &y, const bool x_null) {
		if (IGNORE_NULL) {
			STATE::template AssignValue<A_TYPE>(state.arg, x);
			STATE::template AssignValue<B_TYPE>(state.value, y);
		} else {
			state.arg_null = x_null;
			if (!state.arg_null) {
				STATE::template AssignValue<A_TYPE>(state.arg, x);
			}
			STATE::template AssignValue<B_TYPE>(state.value, y);
		}
	}